

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmpolicytctocsv.cpp
# Opt level: O1

void fmpolicytctocsv::doit(bool skipheader)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  fm_policyTC q;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("layer_id,level_id,agg_id,profile_id");
  }
  sVar1 = fread(&local_28,0x10,1,_stdin);
  while (sVar1 != 0) {
    printf(" %d, %d, %d, %d\n",(ulong)local_20,(ulong)local_28,(ulong)local_24,(ulong)local_1c);
    sVar1 = fread(&local_28,0x10,1,_stdin);
  }
  return;
}

Assistant:

void doit(bool skipheader)
	{

		if (skipheader == false)  printf("layer_id,level_id,agg_id,profile_id\n");

		fm_policyTC q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf(" %d, %d, %d, %d\n", q.layer_id, q.level_id, q.agg_id, q.profile_id);
			i = fread(&q, sizeof(q), 1, stdin);
		}
	}